

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O0

void nsvg__parseTransform(float *xform,char *str)

{
  int iVar1;
  float local_38 [2];
  float t [6];
  char *local_18;
  char *str_local;
  float *xform_local;
  
  nsvg__xformIdentity(xform);
  local_18 = str;
  do {
    while( true ) {
      if (*local_18 == '\0') {
        return;
      }
      iVar1 = strncmp(local_18,"matrix",6);
      if (iVar1 != 0) break;
      iVar1 = nsvg__parseMatrix(local_38,local_18);
LAB_00138193:
      local_18 = local_18 + iVar1;
      nsvg__xformPremultiply(xform,local_38);
    }
    iVar1 = strncmp(local_18,"translate",9);
    if (iVar1 == 0) {
      iVar1 = nsvg__parseTranslate(local_38,local_18);
      goto LAB_00138193;
    }
    iVar1 = strncmp(local_18,"scale",5);
    if (iVar1 == 0) {
      iVar1 = nsvg__parseScale(local_38,local_18);
      goto LAB_00138193;
    }
    iVar1 = strncmp(local_18,"rotate",6);
    if (iVar1 == 0) {
      iVar1 = nsvg__parseRotate(local_38,local_18);
      goto LAB_00138193;
    }
    iVar1 = strncmp(local_18,"skewX",5);
    if (iVar1 == 0) {
      iVar1 = nsvg__parseSkewX(local_38,local_18);
      goto LAB_00138193;
    }
    iVar1 = strncmp(local_18,"skewY",5);
    if (iVar1 == 0) {
      iVar1 = nsvg__parseSkewY(local_38,local_18);
      goto LAB_00138193;
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

static void nsvg__parseTransform(float* xform, const char* str)
{
	float t[6];
	nsvg__xformIdentity(xform);
	while (*str)
	{
		if (strncmp(str, "matrix", 6) == 0)
			str += nsvg__parseMatrix(t, str);
		else if (strncmp(str, "translate", 9) == 0)
			str += nsvg__parseTranslate(t, str);
		else if (strncmp(str, "scale", 5) == 0)
			str += nsvg__parseScale(t, str);
		else if (strncmp(str, "rotate", 6) == 0)
			str += nsvg__parseRotate(t, str);
		else if (strncmp(str, "skewX", 5) == 0)
			str += nsvg__parseSkewX(t, str);
		else if (strncmp(str, "skewY", 5) == 0)
			str += nsvg__parseSkewY(t, str);
		else{
			++str;
			continue;
		}

		nsvg__xformPremultiply(xform, t);
	}
}